

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cRobustnessTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::ResetNotificationStrategy::NoResetNotificationCase::iterate(NoResetNotificationCase *this)

{
  bool bVar1;
  int iVar2;
  deUint32 err;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestContext *this_00;
  undefined4 extraout_var_00;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  int local_34c;
  MessageBuilder local_348;
  int local_1c4 [2];
  GLint status;
  MessageBuilder local_1b0;
  long local_30;
  Functions *gl;
  code *pcStack_20;
  GLint reset;
  PFNGLGETGRAPHICSRESETSTATUS pGetGraphicsResetStatus;
  NoResetNotificationCase *this_local;
  
  pGetGraphicsResetStatus = (PFNGLGETGRAPHICSRESETSTATUS)this;
  bVar1 = checkExtension((this->super_RobustnessBase).super_TestCase.m_context,"GL_KHR_robustness");
  if (bVar1) {
    RobustnessBase::createRobustContext
              (&this->super_RobustnessBase,RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION);
    pRVar3 = RobustnessBase::getRobustContext(&this->super_RobustnessBase);
    (*pRVar3->_vptr_RenderContext[8])();
    pRVar3 = deqp::Context::getRenderContext((this->super_RobustnessBase).super_TestCase.m_context);
    iVar2 = (*pRVar3->_vptr_RenderContext[7])(pRVar3,"glGetGraphicsResetStatus");
    pcStack_20 = (code *)CONCAT44(extraout_var,iVar2);
    if (pcStack_20 == (code *)0x0) {
      this_00 = deqp::Context::getTestContext((this->super_RobustnessBase).super_TestCase.m_context)
      ;
      tcu::TestContext::setTestResult
                (this_00,QP_TEST_RESULT_INTERNAL_ERROR,
                 "Pointer to function glGetGraphicsResetStatus is NULL.");
    }
    else {
      gl._4_4_ = 0;
      pRVar3 = RobustnessBase::getRobustContext(&this->super_RobustnessBase);
      iVar2 = (*pRVar3->_vptr_RenderContext[3])();
      local_30 = CONCAT44(extraout_var_00,iVar2);
      (**(code **)(local_30 + 0x868))(0x8256,(long)&gl + 4);
      err = (**(code **)(local_30 + 0x800))();
      glu::checkError(err,"glGetIntegerv",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cRobustnessTests.cpp"
                      ,0x85);
      if (gl._4_4_ == 0x8261) {
        local_1c4[0] = (*pcStack_20)();
        if (local_1c4[0] == 0) {
          RobustnessBase::releaseRobustContext(&this->super_RobustnessBase);
          pRVar3 = deqp::Context::getRenderContext
                             ((this->super_RobustnessBase).super_TestCase.m_context);
          (*pRVar3->_vptr_RenderContext[8])();
          tcu::TestContext::setTestResult
                    ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_PASS,"Pass");
        }
        else {
          pTVar4 = tcu::TestContext::getLog
                             ((this->super_RobustnessBase).super_TestCase.super_TestCase.
                              super_TestNode.m_testCtx);
          tcu::TestLog::operator<<(&local_348,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
          pMVar5 = tcu::MessageBuilder::operator<<
                             (&local_348,
                              (char (*) [61])
                              "Test failed! glGetGraphicsResetStatus returned wrong value [");
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c4);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2c24a65);
          local_34c = 0;
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_34c);
          pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2af8aaf);
          tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
          tcu::MessageBuilder::~MessageBuilder(&local_348);
          tcu::TestContext::setTestResult
                    ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.
                     m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
        }
      }
      else {
        pTVar4 = tcu::TestContext::getLog
                           ((this->super_RobustnessBase).super_TestCase.super_TestCase.
                            super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_1b0,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar5 = tcu::MessageBuilder::operator<<
                           (&local_1b0,(char (*) [42])"Test failed! glGet returned wrong value [");
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)((long)&gl + 4));
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])0x2c24a65);
        local_1c4[1] = 0x8261;
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1c4 + 1);
        pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2af8aaf);
        tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_1b0);
        tcu::TestContext::setTestResult
                  ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.
                   m_testCtx,QP_TEST_RESULT_FAIL,"Fail");
      }
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_RobustnessBase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

virtual IterateResult iterate(void)
	{
		if (!checkExtension(m_context, "GL_KHR_robustness"))
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");
			return STOP;
		}

		createRobustContext(glu::RESET_NOTIFICATION_STRATEGY_NO_RESET_NOTIFICATION);
		getRobustContext()->makeCurrent();

		PFNGLGETGRAPHICSRESETSTATUS pGetGraphicsResetStatus =
			(PFNGLGETGRAPHICSRESETSTATUS)m_context.getRenderContext().getProcAddress("glGetGraphicsResetStatus");

		if (DE_NULL == pGetGraphicsResetStatus)
		{
			m_context.getTestContext().setTestResult(QP_TEST_RESULT_INTERNAL_ERROR,
													 "Pointer to function glGetGraphicsResetStatus is NULL.");
			return STOP;
		}

		glw::GLint reset = 0;

		const glw::Functions& gl = getRobustContext()->getFunctions();
		gl.getIntegerv(GL_RESET_NOTIFICATION_STRATEGY, &reset);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv");

		if (reset != GL_NO_RESET_NOTIFICATION)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Test failed! glGet returned wrong value [" << reset
							   << ", expected " << GL_NO_RESET_NOTIFICATION << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		glw::GLint status = pGetGraphicsResetStatus();
		if (status != GL_NO_ERROR)
		{
			m_testCtx.getLog() << tcu::TestLog::Message
							   << "Test failed! glGetGraphicsResetStatus returned wrong value [" << status
							   << ", expected " << GL_NO_ERROR << "]." << tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
			return STOP;
		}

		releaseRobustContext();
		m_context.getRenderContext().makeCurrent();

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}